

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6c37a::CommandLineParser::ResetAllOptionOccurrences(CommandLineParser *this)

{
  bool bVar1;
  SubCommand *pSVar2;
  StringMapEntry<llvm::cl::Option_*> *pSVar3;
  StringMapEntry<llvm::cl::Option_*> *O;
  iterator __end2;
  iterator __begin2;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *__range2;
  SubCommand *SC;
  iterator __end1;
  iterator __begin1;
  SmallPtrSet<llvm::cl::SubCommand_*,_4U> *__range1;
  CommandLineParser *this_local;
  
  join_0x00000010_0x00000000_ =
       (SmallPtrSetIteratorImpl)
       llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                 (&(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
  _SC = (SmallPtrSetIteratorImpl)
        llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                  (&(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
  while( true ) {
    bVar1 = llvm::SmallPtrSetIteratorImpl::operator!=
                      ((SmallPtrSetIteratorImpl *)&__end1.super_SmallPtrSetIteratorImpl.End,
                       (SmallPtrSetIteratorImpl *)&SC);
    if (!bVar1) break;
    pSVar2 = llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator*
                       ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)
                        &__end1.super_SmallPtrSetIteratorImpl.End);
    __end2 = llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::begin(&pSVar2->OptionsMap);
    O = (StringMapEntry<llvm::cl::Option_*> *)
        llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::end(&pSVar2->OptionsMap);
    while( true ) {
      bVar1 = llvm::
              iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
              ::operator!=((iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                            *)&__end2,(StringMapIterator<llvm::cl::Option_*> *)&O);
      if (!bVar1) break;
      pSVar3 = llvm::StringMapIterator<llvm::cl::Option_*>::operator*(&__end2);
      llvm::cl::Option::reset(pSVar3->second);
      llvm::
      StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
      ::operator++(&__end2.
                    super_StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
                  );
    }
    llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator++
              ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)
               &__end1.super_SmallPtrSetIteratorImpl.End);
  }
  return;
}

Assistant:

void CommandLineParser::ResetAllOptionOccurrences() {
  // So that we can parse different command lines multiple times in succession
  // we reset all option values to look like they have never been seen before.
  for (auto SC : RegisteredSubCommands) {
    for (auto &O : SC->OptionsMap)
      O.second->reset();
  }
}